

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O1

bool __thiscall Rml::Event::GetParameter<bool>(Event *this,String *key,bool *default_value)

{
  const_iterator cVar1;
  bool result;
  bool local_9;
  
  local_9 = *default_value;
  cVar1 = itlib::
          flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
          ::find<std::__cxx11::string>
                    ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                      *)&this->parameters,key);
  if (cVar1._M_current !=
      (this->parameters).m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Variant::GetInto<bool,_0>(&(cVar1._M_current)->second,&local_9);
  }
  return local_9;
}

Assistant:

T GetParameter(const String& key, const T& default_value) const
	{
		return Get(parameters, key, default_value);
	}